

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O0

void __thiscall http_server::inbound_connection::try_read(inbound_connection *this)

{
  size_t sVar1;
  char *__last1;
  char *__first2;
  char *__last2;
  http_error *e;
  exception *e_1;
  allocator local_71;
  string local_70;
  function<void_()> local_40;
  char *local_20;
  char *i;
  size_t received_now;
  inbound_connection *this_local;
  
  received_now = (size_t)this;
  i = (char *)client_socket::read_some
                        (&this->socket,this->request_buffer + this->request_received,
                         4000 - this->request_received);
  if (i != (char *)0x0) {
    sVar1 = this->request_received;
    __last1 = this->request_buffer + this->request_received + (long)i;
    __first2 = std::begin<char,4ul>((char (*) [4])&(anonymous_namespace)::crlf_crlf);
    __last2 = std::end<char,4ul>((char (*) [4])&(anonymous_namespace)::crlf_crlf);
    local_20 = std::search<char*,char*>(this->request_buffer + (sVar1 - 3),__last1,__first2,__last2)
    ;
    this->request_received = (size_t)(i + this->request_received);
    if (local_20 == this->request_buffer + this->request_received) {
      if (this->request_received == 4000) {
        std::function<void_()>::function(&local_40);
        client_socket::set_on_read(&this->socket,&local_40);
        std::function<void_()>::~function(&local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_70,"Bad Request: request is too large",&local_71);
        send_header(this,bad_request,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
    }
    else {
      std::function<void_()>::function((function<void_()> *)&e_1);
      client_socket::set_on_read(&this->socket,(function<void_()> *)&e_1);
      std::function<void_()>::~function((function<void_()> *)&e_1);
      new_request(this,this->request_buffer,local_20 + 4);
    }
  }
  return;
}

Assistant:

void http_server::inbound_connection::try_read()
{
    size_t received_now = socket.read_some(request_buffer + request_received, sizeof request_buffer - request_received);
    if (received_now == 0)
        return;

    auto i = std::search(request_buffer + request_received - 3,
                         request_buffer + request_received + received_now,
                         std::begin(crlf_crlf),
                         std::end(crlf_crlf));

    request_received += received_now;
    if (i == request_buffer + request_received)
    {
        if (request_received == sizeof request_buffer)
        {
            socket.set_on_read(client_socket::on_ready_t{});
            send_header(http_status_code::bad_request, "Bad Request: request is too large");
        }

        return;
    }

    socket.set_on_read(client_socket::on_ready_t{});

    try
    {
        new_request(request_buffer, i + sizeof crlf_crlf);
    }
    catch (http_error const& e)
    {
        send_header(e.get_status_code(), e.get_reason_phrase());
    }
    catch (std::exception const& e)
    {
        // TODO: if something was already written to socket,
        // we should just drop the connection
        send_header(http_status_code::internal_server_error, e.what());
    }
}